

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O3

void __thiscall Psbt_JoinTxOnly_Test::TestBody(Psbt_JoinTxOnly_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  Psbt psbt2;
  Psbt psbt_txout_only;
  Psbt psbt;
  Psbt psbt_txin_only;
  undefined1 local_188 [32];
  internal local_168 [8];
  _Alloc_hider local_160;
  AssertHelper local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140 [4];
  Psbt local_100;
  Psbt local_b0;
  Psbt local_60;
  
  cfd::core::Psbt::Psbt(&local_b0);
  local_100._vptr_Psbt = (_func_int **)&local_100.base_tx_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA=="
             ,"");
  cfd::core::Psbt::Psbt(&local_60,(string *)&local_100);
  if ((Transaction *)local_100._vptr_Psbt != &local_100.base_tx_) {
    operator_delete(local_100._vptr_Psbt);
  }
  local_150._M_allocated_capacity = (size_type)local_140;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA="
             ,"");
  cfd::core::Psbt::Psbt(&local_100,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_allocated_capacity != local_140) {
    operator_delete((void *)local_150._M_allocated_capacity);
  }
  cfd::core::Psbt::operator=(&local_b0,&local_60);
  cfd::core::Psbt::Join(&local_b0,&local_100,true);
  cfd::core::Psbt::GetData((ByteData *)local_188,&local_b0);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_150,(ByteData *)local_188);
  testing::internal::CmpHelperSTREQ
            (local_168,
             "\"70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000000000000"
             ,(char *)local_150._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_allocated_capacity != local_140) {
    operator_delete((void *)local_150._M_allocated_capacity);
  }
  if ((AssertHelperData *)local_188._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_188._0_8_);
  }
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_150._M_allocated_capacity);
    if (local_160._M_p == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_160._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x281,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_188,(Message *)&local_150._M_allocated_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_allocated_capacity !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*local_150._M_allocated_capacity + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData((ByteData *)local_188,&local_b0);
  cfd::core::Psbt::Psbt((Psbt *)&local_150,(ByteData *)local_188);
  if ((AssertHelperData *)local_188._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_188._0_8_);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)local_188,(Psbt *)&local_150);
  testing::internal::CmpHelperSTREQ
            (local_168,
             "\"cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAAAAAA=\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAAAAAA="
             ,(char *)local_188._0_8_);
  if ((AssertHelperData *)local_188._0_8_ != (AssertHelperData *)(local_188 + 0x10)) {
    operator_delete((void *)local_188._0_8_);
  }
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if (local_160._M_p == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_160._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x283,pcVar2);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((AssertHelperData *)local_188._0_8_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((AssertHelperData *)local_188._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_188._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::~Psbt((Psbt *)&local_150);
  cfd::core::Psbt::~Psbt(&local_100);
  cfd::core::Psbt::~Psbt(&local_60);
  cfd::core::Psbt::~Psbt(&local_b0);
  return;
}

Assistant:

TEST(Psbt, JoinTxOnly) {
  Psbt psbt;
  Psbt psbt_txin_only("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==");
  Psbt psbt_txout_only("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=");

  psbt = psbt_txin_only;
  psbt.Join(psbt_txout_only, true);

  EXPECT_STREQ("70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000000000000", psbt.GetData().GetHex().c_str());
  Psbt psbt2(psbt.GetData());
  EXPECT_STREQ("cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAAAAAA=", psbt2.GetBase64().c_str());
}